

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::ComparisonTest_MatchedUnknownFieldTagTest_Test::TestBody
          (ComparisonTest_MatchedUnknownFieldTagTest_Test *this)

{
  string *psVar1;
  char *message;
  AssertionResult gtest_ar;
  AssertHelper AStack_48;
  internal local_40 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  string local_30;
  
  UnknownFieldSet::AddVarint((this->super_ComparisonTest).unknown1_,0xf0,0x7a);
  UnknownFieldSet::AddVarint((this->super_ComparisonTest).unknown2_,0xf0,0x79);
  UnknownFieldSet::AddFixed32((this->super_ComparisonTest).unknown1_,0xf1,1);
  UnknownFieldSet::AddFixed64((this->super_ComparisonTest).unknown2_,0xf1,2);
  psVar1 = UnknownFieldSet::AddLengthDelimited_abi_cxx11_
                     ((this->super_ComparisonTest).unknown1_,0xf2);
  std::__cxx11::string::_M_replace((ulong)psVar1,0,(char *)psVar1->_M_string_length,0x127416e);
  psVar1 = UnknownFieldSet::AddLengthDelimited_abi_cxx11_
                     ((this->super_ComparisonTest).unknown2_,0xf2);
  std::__cxx11::string::_M_replace((ulong)psVar1,0,(char *)psVar1->_M_string_length,0x1274c3f);
  protobuf::(anonymous_namespace)::ComparisonTest::Run_abi_cxx11_
            (&local_30,this,(Message *)&(this->super_ComparisonTest).empty1_,
             (Message *)&(this->super_ComparisonTest).empty2_);
  testing::internal::CmpHelperEQ<char[125],std::__cxx11::string>
            (local_40,
             "\"modified: 240[0]: 122 -> 121\\n\" \"deleted: 241[0]: 0x00000001\\n\" \"added: 241[0]: 0x0000000000000002\\n\" \"modified: 242[0]: \\\"cat\\\" -> \\\"dog\\\"\\n\""
             ,"RunUn()",
             (char (*) [125])
             "modified: 240[0]: 122 -> 121\ndeleted: 241[0]: 0x00000001\nadded: 241[0]: 0x0000000000000002\nmodified: 242[0]: \"cat\" -> \"dog\"\n"
             ,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_38 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = anon_var_dwarf_a12c75 + 5;
    }
    else {
      message = (local_38->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0xe9c,message);
    testing::internal::AssertHelper::operator=(&AStack_48,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&AStack_48);
    if ((long *)local_30._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_30._M_dataplus._M_p + 8))();
    }
  }
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_38,local_38);
  }
  return;
}

Assistant:

TEST_F(ComparisonTest, MatchedUnknownFieldTagTest) {
  unknown1_->AddVarint(240, 122);
  unknown2_->AddVarint(240, 121);
  unknown1_->AddFixed32(241, 1);
  unknown2_->AddFixed64(241, 2);
  unknown1_->AddLengthDelimited(242, "cat");
  unknown2_->AddLengthDelimited(242, "dog");

  EXPECT_EQ(
      "modified: 240[0]: 122 -> 121\n"
      "deleted: 241[0]: 0x00000001\n"
      "added: 241[0]: 0x0000000000000002\n"
      "modified: 242[0]: \"cat\" -> \"dog\"\n",
      RunUn());
}